

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmRemoveFile(char *name)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,name,&local_29);
  cmsys::SystemTools::RemoveFile(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void CCONV cmRemoveFile(const char* name)
{
  cmSystemTools::RemoveFile(name);
}